

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Production.cpp
# Opt level: O2

bool __thiscall
SGParser::Generator::ParseTableProduction::operator==
          (ParseTableProduction *this,ParseTableProduction *right)

{
  bool bVar1;
  
  bVar1 = Production::operator==(this->pProduction,right->pProduction);
  if ((bVar1) && (this->Dot == right->Dot)) {
    bVar1 = std::operator==(&(this->LookAhead)._M_t,&(right->LookAhead)._M_t);
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ParseTableProduction::operator==(const ParseTableProduction& right) const noexcept {
    return (*pProduction == *right.pProduction) && (Dot == right.Dot) &&
           (LookAhead == right.LookAhead);
}